

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.hpp
# Opt level: O1

void __thiscall
cs::statement_namespace::statement_namespace
          (statement_namespace *this,token_base *tbp,
          deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *block,context_t *c,
          token_base *ptr)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  
  uVar1 = *(undefined4 *)
           &(c->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  uVar2 = *(undefined4 *)
           ((long)&(c->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr + 4)
  ;
  uVar3 = *(undefined4 *)
           &(c->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  uVar4 = *(undefined4 *)
           ((long)&(c->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
                   ._M_pi + 4);
  (c->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0
  ;
  (c->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_statement_base)._vptr_statement_base = (_func_int **)&PTR__statement_base_00251d78;
  *(undefined4 *)
   &(this->super_statement_base).context.
    super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr = uVar1;
  *(undefined4 *)
   ((long)&(this->super_statement_base).context.
           super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4) = uVar2;
  *(undefined4 *)
   &(this->super_statement_base).context.
    super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = uVar3;
  *(undefined4 *)
   ((long)&(this->super_statement_base).context.
           super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 4) =
       uVar4;
  (this->super_statement_base).line_num = ptr->line_num;
  (this->super_statement_base)._vptr_statement_base =
       (_func_int **)&PTR__statement_namespace_002575c8;
  (this->mName)._M_dataplus._M_p = (pointer)&(this->mName).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->mName,tbp[3]._vptr_token_base,
             tbp[3].line_num + (long)tbp[3]._vptr_token_base);
  std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::_Deque_base
            (&(this->mBlock).
              super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>,
             &block->super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>)
  ;
  return;
}

Assistant:

statement_namespace(token_base *tbp, std::deque<statement_base *> block, context_t c, token_base *ptr)
			: statement_base(std::move(c), ptr), mName(static_cast<token_id *>(tbp)->get_id()),
			  mBlock(std::move(block)) {}